

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

Element __thiscall ftxui::SliderBase<float>::Render(SliderBase<float> *this)

{
  float fVar1;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  bool bVar2;
  string *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  Element EVar4;
  shared_ptr<ftxui::Node> *local_3d0;
  shared_ptr<ftxui::Node> *local_3b8;
  Decorator local_330;
  Decorator local_310;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_2f0;
  allocator<std::shared_ptr<ftxui::Node>_> local_2ca;
  undefined1 local_2c9;
  Decorator local_2c8;
  allocator<std::shared_ptr<ftxui::Node>_> local_2a3;
  undefined1 local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  Decorator local_280;
  Decorator local_260;
  Decorator local_240;
  Element local_220;
  Element local_210;
  Element local_200;
  allocator<char> local_1e9;
  string local_1e8;
  ftxui *local_1c8;
  undefined1 local_1c0 [32];
  ftxui local_1a0 [16];
  shared_ptr<ftxui::Node> local_190;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_180;
  Element local_168;
  Decorator local_158;
  Decorator local_138;
  string local_108;
  Element local_e8;
  Element local_d8;
  ftxui *local_c8;
  undefined1 local_c0 [32];
  shared_ptr<ftxui::Node> local_a0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_90;
  Element local_78;
  Element local_68;
  Element local_58;
  float local_44;
  Color local_40;
  float percent;
  undefined1 local_38 [8];
  Decorator gauge_color;
  SliderBase<float> *this_local;
  
  bVar2 = ComponentBase::Focused(in_RSI);
  if (bVar2) {
    Color::Color((Color *)&percent,GrayLight);
    color((Decorator *)local_38,(Color)percent);
  }
  else {
    Color::Color(&local_40,GrayDark);
    color((Decorator *)local_38,local_40);
  }
  fVar1 = *(float *)&in_RSI[2].children_.
                     super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  local_44 = (*(float *)in_RSI[2]._vptr_ComponentBase - fVar1) /
             (*(float *)((long)&in_RSI[2].children_.
                                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) - fVar1);
  local_2c9 = 1;
  local_c8 = (ftxui *)local_c0;
  psVar3 = ConstStringRef::operator*[abi_cxx11_((ConstStringRef *)(in_RSI + 1));
  std::__cxx11::string::string((string *)&local_108,(string *)psVar3);
  text((ftxui *)&local_e8,&local_108);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_138,dim)
  ;
  operator|((ftxui *)&local_d8,&local_e8,&local_138);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_158,
             vcenter);
  operator|((ftxui *)local_c0,&local_d8,&local_158);
  local_2a2 = 1;
  local_1c8 = (ftxui *)local_1c0;
  local_c8 = (ftxui *)(local_c0 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"[",&local_1e9);
  text((ftxui *)local_1c0,&local_1e8);
  local_1c8 = (ftxui *)(local_1c0 + 0x10);
  gauge((ftxui *)&local_220,local_44);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_240,
             underlined);
  operator|((ftxui *)&local_210,&local_220,&local_240);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_260,
             xflex);
  operator|((ftxui *)&local_200,&local_210,&local_260);
  reflect(&local_280,(Box *)((long)&in_RSI[2].parent_ + 4));
  operator|((ftxui *)(local_1c0 + 0x10),&local_200,&local_280);
  local_1c8 = local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"]",&local_2a1);
  text(local_1a0,&local_2a0);
  local_2a2 = 0;
  local_190.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1c0;
  local_190.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_2a3);
  __l._M_len = (size_type)
               local_190.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_190.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_180,__l,&local_2a3);
  hbox((ftxui *)&local_168,&local_180);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_2c8,
             xflex);
  operator|((ftxui *)(local_c0 + 0x10),&local_168,&local_2c8);
  local_2c9 = 0;
  local_a0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0;
  local_a0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_2ca);
  __l_00._M_len =
       (size_type)
       local_a0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l_00._M_array =
       (iterator)local_a0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_90,__l_00,&local_2ca);
  hbox((ftxui *)&local_78,&local_90);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
            (&local_2f0,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_38);
  operator|((ftxui *)&local_68,&local_78,&local_2f0);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_310,
             xflex);
  operator|((ftxui *)&local_58,&local_68,&local_310);
  reflect(&local_330,
          (Box *)((long)&in_RSI[2].children_.
                         super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4));
  operator|((ftxui *)this,&local_58,&local_330);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_330);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_58);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_310);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_68);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_2f0);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_78);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_90);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_2ca);
  local_3b8 = &local_a0;
  do {
    local_3b8 = local_3b8 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_3b8);
  } while (local_3b8 != (shared_ptr<ftxui::Node> *)local_c0);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_2c8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_168);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_180);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_2a3);
  local_3d0 = &local_190;
  do {
    local_3d0 = local_3d0 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_3d0);
  } while (local_3d0 != (shared_ptr<ftxui::Node> *)local_1c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_280);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_200);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_260);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_210);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_240);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_220);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_158);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_d8);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_138);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
            ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_38);
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    auto gauge_color =
        Focused() ? color(Color::GrayLight) : color(Color::GrayDark);
    float percent = float(*value_ - min_) / float(max_ - min_);
    return hbox({
               text(*label_) | dim | vcenter,
               hbox({
                   text("["),
                   gauge(percent) | underlined | xflex | reflect(gauge_box_),
                   text("]"),
               }) | xflex,
           }) |
           gauge_color | xflex | reflect(box_);
  }